

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiQueryToken(Fts5Context *pCtx,int iPhrase,int iToken,char **ppOut,int *pnOut)

{
  int iVar1;
  char **in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  Fts5Cursor *pCsr;
  
  iVar1 = sqlite3Fts5ExprQueryToken(*(Fts5Expr **)(in_RDI + 0x40),in_ESI,in_EDX,in_RCX,in_R8);
  return iVar1;
}

Assistant:

static int fts5ApiQueryToken(
  Fts5Context* pCtx,
  int iPhrase,
  int iToken,
  const char **ppOut,
  int *pnOut
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  return sqlite3Fts5ExprQueryToken(pCsr->pExpr, iPhrase, iToken, ppOut, pnOut);
}